

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImGui::RenderCheckMark(ImDrawList *draw_list,ImVec2 pos,ImU32 col,float sz)

{
  ImVec2 *pIVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImVec2 *pIVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float thickness;
  float fVar8;
  float fVar9;
  float fVar10;
  
  thickness = sz / 5.0;
  if (thickness <= 1.0) {
    thickness = 1.0;
  }
  fVar8 = sz - thickness * 0.5;
  fVar9 = fVar8 / 3.0;
  fVar10 = pos.x + thickness * 0.25 + fVar9;
  fVar8 = (pos.y + thickness * 0.25 + fVar8) - fVar9 * 0.5;
  iVar6 = (draw_list->_Path).Size;
  iVar7 = (draw_list->_Path).Capacity;
  if (iVar6 == iVar7) {
    iVar6 = iVar6 + 1;
    if (iVar7 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar7 / 2 + iVar7;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar7 < iVar6) {
      pIVar4 = (ImVec2 *)MemAlloc((long)iVar6 << 3);
      pIVar1 = (draw_list->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar4,pIVar1,(long)(draw_list->_Path).Size << 3);
        MemFree((draw_list->_Path).Data);
      }
      (draw_list->_Path).Data = pIVar4;
      (draw_list->_Path).Capacity = iVar6;
    }
  }
  IVar3.y = fVar8 - fVar9;
  IVar3.x = fVar10 - fVar9;
  (draw_list->_Path).Data[(draw_list->_Path).Size] = IVar3;
  iVar7 = (draw_list->_Path).Size;
  iVar5 = (draw_list->_Path).Capacity;
  iVar6 = iVar7 + 1;
  (draw_list->_Path).Size = iVar6;
  if (iVar6 == iVar5) {
    iVar7 = iVar7 + 2;
    if (iVar5 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar5 / 2 + iVar5;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar5 < iVar7) {
      pIVar4 = (ImVec2 *)MemAlloc((long)iVar7 << 3);
      pIVar1 = (draw_list->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar4,pIVar1,(long)(draw_list->_Path).Size << 3);
        MemFree((draw_list->_Path).Data);
      }
      (draw_list->_Path).Data = pIVar4;
      (draw_list->_Path).Capacity = iVar7;
    }
  }
  pIVar1 = (draw_list->_Path).Data;
  iVar6 = (draw_list->_Path).Size;
  pIVar1[iVar6].x = fVar10;
  pIVar1[iVar6].y = fVar8;
  iVar7 = (draw_list->_Path).Size;
  iVar5 = (draw_list->_Path).Capacity;
  iVar6 = iVar7 + 1;
  (draw_list->_Path).Size = iVar6;
  if (iVar6 == iVar5) {
    iVar7 = iVar7 + 2;
    if (iVar5 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar5 / 2 + iVar5;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar5 < iVar7) {
      pIVar4 = (ImVec2 *)MemAlloc((long)iVar7 << 3);
      pIVar1 = (draw_list->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar4,pIVar1,(long)(draw_list->_Path).Size << 3);
        MemFree((draw_list->_Path).Data);
      }
      (draw_list->_Path).Data = pIVar4;
      (draw_list->_Path).Capacity = iVar7;
    }
  }
  IVar2.y = -fVar9 + -fVar9 + fVar8;
  IVar2.x = fVar9 + fVar9 + fVar10;
  (draw_list->_Path).Data[(draw_list->_Path).Size] = IVar2;
  iVar6 = (draw_list->_Path).Size + 1;
  (draw_list->_Path).Size = iVar6;
  ImDrawList::AddPolyline(draw_list,(draw_list->_Path).Data,iVar6,col,false,thickness);
  (draw_list->_Path).Size = 0;
  return;
}

Assistant:

void ImGui::RenderCheckMark(ImDrawList* draw_list, ImVec2 pos, ImU32 col, float sz)
{
    float thickness = ImMax(sz / 5.0f, 1.0f);
    sz -= thickness * 0.5f;
    pos += ImVec2(thickness * 0.25f, thickness * 0.25f);

    float third = sz / 3.0f;
    float bx = pos.x + third;
    float by = pos.y + sz - third * 0.5f;
    draw_list->PathLineTo(ImVec2(bx - third, by - third));
    draw_list->PathLineTo(ImVec2(bx, by));
    draw_list->PathLineTo(ImVec2(bx + third * 2.0f, by - third * 2.0f));
    draw_list->PathStroke(col, false, thickness);
}